

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

string * format_json_value(string *__return_storage_ptr__,string *field,string *value)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  field_type fVar5;
  size_type sVar6;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char local_38 [8];
  
  fVar5 = test::get_field_type(field);
  if (fVar5 == BOOL) {
    bVar4 = std::operator==(value,"0");
    __s = "true";
    if (bVar4) {
      __s = "false";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_58);
  }
  else if (fVar5 == STRING) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    pcVar2 = (value->_M_dataplus)._M_p;
    sVar3 = value->_M_string_length;
    for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = pcVar2[sVar6];
      if ((cVar1 == '\\') || (cVar1 == '\"')) {
        std::__cxx11::string::append((char *)&local_78);
      }
      else if (cVar1 < ' ') {
        snprintf(local_38,8,"\\u%04x");
        std::__cxx11::string::append((char *)&local_78);
      }
      else {
        std::__cxx11::string::push_back((char)&local_78);
      }
    }
    std::operator+(&local_58,"\"",&local_78);
    std::operator+(__return_storage_ptr__,&local_58,"\"");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_json_value(const std::string & field, const std::string & value) {
    switch (test::get_field_type(field)) {
        case test::STRING:
            return "\"" + escape_json(value) + "\"";
        case test::BOOL:
            return value == "0" ? "false" : "true";
        default:
            return value;
    }
}